

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

boolean inside_region(region *reg,int x,int y)

{
  boolean bVar1;
  int local_24;
  int i;
  int y_local;
  int x_local;
  region *reg_local;
  
  if ((reg != (region *)0x0) && (bVar1 = inside_rect(&reg->bounding_box,x,y), bVar1 != '\0')) {
    local_24 = 0;
    while( true ) {
      if (reg->nrects <= local_24) {
        return '\0';
      }
      bVar1 = inside_rect(reg->rects + local_24,x,y);
      if (bVar1 != '\0') break;
      local_24 = local_24 + 1;
    }
    return '\x01';
  }
  return '\0';
}

Assistant:

static boolean inside_region(struct region *reg, int x, int y)
{
    int i;

    if (reg == NULL || !inside_rect(&(reg->bounding_box), x, y))
	return FALSE;
    for (i = 0; i < reg->nrects; i++)
	if (inside_rect(&(reg->rects[i]), x, y))
	    return TRUE;
    return FALSE;
}